

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

time_t mg_mgr_poll(mg_mgr *mgr,int milli)

{
  mg_connection *pmVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  uint local_1fc;
  int fd_flags;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int num_selected;
  int num_fds;
  sock_t max_fd;
  fd_set err_set;
  fd_set write_set;
  fd_set read_set;
  timeval tv;
  mg_connection *tmp;
  mg_connection *nc;
  double now;
  int milli_local;
  mg_mgr *mgr_local;
  
  dVar4 = mg_time();
  num_selected = -1;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    write_set.fds_bits[(ulong)(uint)__arr + 0xf] = 0;
  }
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    err_set.fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
  }
  for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
    (&num_fds + (ulong)__arr_2._4_4_ * 2)[0] = 0;
    (&num_fds + (ulong)__arr_2._4_4_ * 2)[1] = 0;
  }
  mg_add_to_set(mgr->ctl[1],(fd_set *)(write_set.fds_bits + 0xf),&num_selected);
  __i = 0;
  pmVar1 = mgr->active_connections;
  while (tmp = pmVar1, tmp != (mg_connection *)0x0) {
    pmVar1 = tmp->next;
    if (tmp->sock == -1) {
      mg_mgr_handle_conn(tmp,0,dVar4);
    }
    else {
      __i = __i + 1;
      if ((((tmp->flags & 0x40) == 0) && ((tmp->recv_mbuf).len < tmp->recv_mbuf_limit)) &&
         (((tmp->flags & 2) == 0 || (tmp->listener == (mg_connection *)0x0)))) {
        mg_add_to_set(tmp->sock,(fd_set *)(write_set.fds_bits + 0xf),&num_selected);
      }
      if ((((tmp->flags & 8) != 0) && ((tmp->flags & 0x20) == 0)) ||
         (((tmp->send_mbuf).len != 0 && ((tmp->flags & 8) == 0)))) {
        mg_add_to_set(tmp->sock,(fd_set *)(err_set.fds_bits + 0xf),&num_selected);
        mg_add_to_set(tmp->sock,(fd_set *)&num_fds,&num_selected);
      }
    }
  }
  read_set.fds_bits[0xf] = (__fd_mask)(milli / 1000);
  uVar2 = select(num_selected + 1,(fd_set *)(write_set.fds_bits + 0xf),
                 (fd_set *)(err_set.fds_bits + 0xf),(fd_set *)&num_fds,
                 (timeval *)(read_set.fds_bits + 0xf));
  dVar4 = mg_time();
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_mgr_poll");
    cs_log_printf("select @ %ld num_ev=%d of %d",(long)dVar4,(ulong)uVar2,(ulong)__i);
  }
  if (((0 < (int)uVar2) && (mgr->ctl[1] != -1)) &&
     ((write_set.fds_bits[(long)(mgr->ctl[1] / 0x40) + 0xf] &
      1L << ((byte)((long)mgr->ctl[1] % 0x40) & 0x3f)) != 0)) {
    mg_mgr_handle_ctl_sock(mgr);
  }
  tmp = mgr->active_connections;
  while (tmp != (mg_connection *)0x0) {
    local_1fc = 0;
    if (0 < (int)uVar2) {
      uVar3 = 0;
      if ((err_set.fds_bits[(long)(tmp->sock / 0x40) + 0xf] &
          1L << ((byte)((long)tmp->sock % 0x40) & 0x3f)) != 0) {
        uVar3 = 2;
      }
      local_1fc = 0;
      if ((*(ulong *)(&num_fds + (long)(tmp->sock / 0x40) * 2) &
          1L << ((byte)((long)tmp->sock % 0x40) & 0x3f)) != 0) {
        local_1fc = 4;
      }
      local_1fc = (write_set.fds_bits[(long)(tmp->sock / 0x40) + 0xf] &
                  1L << ((byte)((long)tmp->sock % 0x40) & 0x3f)) != 0 | uVar3 | local_1fc;
    }
    pmVar1 = tmp->next;
    mg_mgr_handle_conn(tmp,local_1fc,dVar4);
    tmp = pmVar1;
  }
  pmVar1 = mgr->active_connections;
  while (tmp = pmVar1, tmp != (mg_connection *)0x0) {
    pmVar1 = tmp->next;
    if (((tmp->flags & 0x800) != 0) || (((tmp->send_mbuf).len == 0 && ((tmp->flags & 0x400) != 0))))
    {
      mg_close_conn(tmp);
    }
  }
  return (long)dVar4;
}

Assistant:

time_t mg_mgr_poll(struct mg_mgr *mgr, int milli) {
    double now = mg_time();
    struct mg_connection *nc, *tmp;
    struct timeval tv;
    fd_set read_set, write_set, err_set;
    sock_t max_fd = INVALID_SOCKET;
    int num_fds, num_selected;

    FD_ZERO(&read_set);
    FD_ZERO(&write_set);
    FD_ZERO(&err_set);
#ifndef MG_DISABLE_SOCKETPAIR
    mg_add_to_set(mgr->ctl[1], &read_set, &max_fd);
#endif

    for (nc = mgr->active_connections, num_fds = 0; nc != NULL; nc = tmp) {
        tmp = nc->next;

        if (nc->sock == INVALID_SOCKET) {
            mg_mgr_handle_conn(nc, 0, now);
            continue;
        }

        num_fds++;

        if (!(nc->flags & MG_F_WANT_WRITE) &&
            nc->recv_mbuf.len < nc->recv_mbuf_limit &&
            (!(nc->flags & MG_F_UDP) || nc->listener == NULL)) {
            mg_add_to_set(nc->sock, &read_set, &max_fd);
        }

        if (((nc->flags & MG_F_CONNECTING) && !(nc->flags & MG_F_WANT_READ)) ||
            (nc->send_mbuf.len > 0 && !(nc->flags & MG_F_CONNECTING))) {
            mg_add_to_set(nc->sock, &write_set, &max_fd);
            mg_add_to_set(nc->sock, &err_set, &max_fd);
        }
    }

    tv.tv_sec = milli / 1000;
    tv.tv_usec = (milli % 1000) * 1000;

    num_selected = select((int) max_fd + 1, &read_set, &write_set, &err_set, &tv);
    now = mg_time();
    DBG(("select @ %ld num_ev=%d of %d", (long) now, num_selected, num_fds));

#ifndef MG_DISABLE_SOCKETPAIR
    if (num_selected > 0 && mgr->ctl[1] != INVALID_SOCKET &&
        FD_ISSET(mgr->ctl[1], &read_set)) {
        mg_mgr_handle_ctl_sock(mgr);
    }
#endif

    for (nc = mgr->active_connections; nc != NULL; nc = tmp) {
        int fd_flags = 0;
        if (num_selected > 0) {
            fd_flags = (FD_ISSET(nc->sock, &read_set) ? _MG_F_FD_CAN_READ : 0) |
                       (FD_ISSET(nc->sock, &write_set) ? _MG_F_FD_CAN_WRITE : 0) |
                       (FD_ISSET(nc->sock, &err_set) ? _MG_F_FD_ERROR : 0);
        }
#ifdef MG_CC3200
                                                                                                                                // CC3200 does not report UDP sockets as writeable.
    if (nc->flags & MG_F_UDP &&
        (nc->send_mbuf.len > 0 || nc->flags & MG_F_CONNECTING)) {
      fd_flags |= _MG_F_FD_CAN_WRITE;
    }
#endif
#ifdef MG_LWIP
                                                                                                                                /* With LWIP socket emulation layer, we don't get write events */
    fd_flags |= _MG_F_FD_CAN_WRITE;
#endif
        tmp = nc->next;
        mg_mgr_handle_conn(nc, fd_flags, now);
    }

    for (nc = mgr->active_connections; nc != NULL; nc = tmp) {
        tmp = nc->next;
        if ((nc->flags & MG_F_CLOSE_IMMEDIATELY) ||
            (nc->send_mbuf.len == 0 && (nc->flags & MG_F_SEND_AND_CLOSE))) {
            mg_close_conn(nc);
        }
    }

    return now;
}